

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathNodeSetAdd(xmlNodeSetPtr cur,xmlNodePtr val)

{
  int iVar1;
  int iVar2;
  xmlNodePtr *ppxVar3;
  xmlNodePtr pxVar4;
  long lVar5;
  char *extra;
  xmlNsPtr ns;
  
  if (val == (xmlNodePtr)0x0 || cur == (xmlNodeSetPtr)0x0) {
    return -1;
  }
  iVar1 = cur->nodeNr;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      if (cur->nodeTab[lVar5] == val) {
        return 0;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  iVar2 = cur->nodeMax;
  if ((long)iVar2 == 0) {
    ppxVar3 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    cur->nodeTab = ppxVar3;
    if (ppxVar3 != (xmlNodePtr *)0x0) {
      ppxVar3[8] = (xmlNodePtr)0x0;
      ppxVar3[9] = (xmlNodePtr)0x0;
      ppxVar3[6] = (xmlNodePtr)0x0;
      ppxVar3[7] = (xmlNodePtr)0x0;
      ppxVar3[4] = (xmlNodePtr)0x0;
      ppxVar3[5] = (xmlNodePtr)0x0;
      ppxVar3[2] = (xmlNodePtr)0x0;
      ppxVar3[3] = (xmlNodePtr)0x0;
      *ppxVar3 = (xmlNodePtr)0x0;
      ppxVar3[1] = (xmlNodePtr)0x0;
      cur->nodeMax = 10;
      goto LAB_001d9d59;
    }
  }
  else {
    if (iVar1 != iVar2) {
LAB_001d9d59:
      if (val->type == XML_NAMESPACE_DECL) {
        pxVar4 = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val);
        iVar1 = cur->nodeNr;
        cur->nodeNr = iVar1 + 1;
        cur->nodeTab[iVar1] = pxVar4;
      }
      else {
        iVar1 = cur->nodeNr;
        cur->nodeNr = iVar1 + 1;
        cur->nodeTab[iVar1] = val;
      }
      return 0;
    }
    if (9999999 < iVar2) {
      extra = "growing nodeset hit limit\n";
      goto LAB_001d9d9a;
    }
    ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)iVar2 << 4);
    if (ppxVar3 != (xmlNodePtr *)0x0) {
      cur->nodeMax = cur->nodeMax << 1;
      cur->nodeTab = ppxVar3;
      goto LAB_001d9d59;
    }
  }
  extra = "growing nodeset\n";
LAB_001d9d9a:
  xmlXPathErrMemory((xmlXPathContextPtr)0x0,extra);
  return -1;
}

Assistant:

int
xmlXPathNodeSetAdd(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if ((cur == NULL) || (val == NULL)) return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) return(0);

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeMax == 0) {
        cur->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (cur->nodeTab == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	memset(cur->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
        cur->nodeMax = XML_NODESET_DEFAULT;
    } else if (cur->nodeNr == cur->nodeMax) {
        xmlNodePtr *temp;

        if (cur->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
            xmlXPathErrMemory(NULL, "growing nodeset hit limit\n");
            return(-1);
        }
	temp = (xmlNodePtr *) xmlRealloc(cur->nodeTab, cur->nodeMax * 2 *
				      sizeof(xmlNodePtr));
	if (temp == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
        cur->nodeMax *= 2;
	cur->nodeTab = temp;
    }
    if (val->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) val;

        /* TODO: Check memory error. */
	cur->nodeTab[cur->nodeNr++] =
	    xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);
    } else
	cur->nodeTab[cur->nodeNr++] = val;
    return(0);
}